

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmaps.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  anon_class_1_0_00000001 local_1d;
  anon_class_1_0_00000001 local_1c;
  anon_class_1_0_00000001 local_1b;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  anon_class_1_0_00000001 make_2size_t;
  anon_class_1_0_00000001 make_2string;
  anon_class_1_0_00000001 make_2int;
  anon_class_1_0_00000001 make_string;
  char **ppcStack_18;
  anon_class_1_0_00000001 make_int;
  char **param_1_local;
  int param_0_local;
  
  ppcStack_18 = param_2;
  test_set<phmap::flat_hash_set<int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>,main::__0>
            (&local_19);
  test_set<phmap::flat_hash_set<std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,main::__1>
            (&local_1a);
  test_set<phmap::node_hash_set<int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>,main::__0>
            (&local_19);
  test_set<phmap::node_hash_set<std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,main::__1>
            (&local_1a);
  test_set<phmap::flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>,main::__2>
            (&local_1b);
  test_set<phmap::flat_hash_map<std::__cxx11::string,std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,main::__3>
            (&local_1c);
  test_set<phmap::node_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>>,main::__2>
            (&local_1b);
  test_set<phmap::node_hash_map<std::__cxx11::string,std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,main::__3>
            (&local_1c);
  test_set<phmap::parallel_flat_hash_set<int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>,4ul,phmap::NullMutex>,main::__0>
            (&local_19);
  test_set<phmap::parallel_flat_hash_set<std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>,4ul,phmap::NullMutex>,main::__1>
            (&local_1a);
  test_set<phmap::parallel_node_hash_set<int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>,4ul,phmap::NullMutex>,main::__0>
            (&local_19);
  test_set<phmap::parallel_node_hash_set<std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>,4ul,phmap::NullMutex>,main::__1>
            (&local_1a);
  test_set<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,phmap::NullMutex>,main::__2>
            (&local_1b);
  test_set<phmap::parallel_flat_hash_map<std::__cxx11::string,std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,4ul,phmap::NullMutex>,main::__3>
            (&local_1c);
  test_set<phmap::parallel_node_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,phmap::NullMutex>,main::__2>
            (&local_1b);
  test_set<phmap::parallel_node_hash_map<std::__cxx11::string,std::__cxx11::string,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,4ul,phmap::NullMutex>,main::__3>
            (&local_1c);
  test_set<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,main::__4>
            (&local_1d);
  return 0;
}

Assistant:

int main(int, char **)
{
    using namespace std;

    auto make_int    = [](int i) { return i; };
    auto make_string = [](int i) { return std::to_string(i); };

    auto make_2int    = [](int i) { return std::make_pair(i, i); };
    auto make_2string = [](int i) { return std::make_pair(std::to_string(i), std::to_string(i)); };
    

    test_set<phmap::flat_hash_set<int>>(make_int);
    test_set<phmap::flat_hash_set<string>>(make_string);

    test_set<phmap::node_hash_set<int>>(make_int);
    test_set<phmap::node_hash_set<string>>(make_string);

    test_set<phmap::flat_hash_map<int, int>>(make_2int);
    test_set<phmap::flat_hash_map<string, string>>(make_2string);

    test_set<phmap::node_hash_map<int, int>>(make_2int);
    test_set<phmap::node_hash_map<string, string>>(make_2string);

    test_set<phmap::parallel_flat_hash_set<int>>(make_int);
    test_set<phmap::parallel_flat_hash_set<string>>(make_string);

    test_set<phmap::parallel_node_hash_set<int>>(make_int);
    test_set<phmap::parallel_node_hash_set<string>>(make_string);

    test_set<phmap::parallel_flat_hash_map<int, int>>(make_2int);
    test_set<phmap::parallel_flat_hash_map<string, string>>(make_2string);

    test_set<phmap::parallel_node_hash_map<int, int>>(make_2int);
    test_set<phmap::parallel_node_hash_map<string, string>>(make_2string);

    // example of using default parameters in order to specify the mutex type.
    // 
    // Please be aware that the iterators returned (by find for example) cannot 
    // be safely read in a multithreaded environment. Instead use if_contains(), 
    // which passes a reference value to the callback while holding the submap lock. 
    // Similarly, write access can be done safely using modify_if, try_emplace_l 
    // or lazy_emplace_l.
    // ----------------------------------------------------------------------------
    using Map = phmap::parallel_flat_hash_map<std::size_t, std::size_t,
                                              std::hash<size_t>,
                                              std::equal_to<size_t>, 
                                              std::allocator<std::pair<const size_t, size_t>>, 
                                              4, 
                                              std::mutex>;
    auto make_2size_t    = [](size_t i) { return std::make_pair(i, i); };
    test_set<Map>(make_2size_t);
}